

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void build_tree(deflate_state *s,tree_desc *desc)

{
  short *psVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ct_data *tree;
  ct_data *pcVar6;
  static_tree_desc *psVar7;
  ct_data *pcVar8;
  intf *piVar9;
  int iVar10;
  ushort uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  intf iVar25;
  uint uVar26;
  ush *puVar27;
  uint uVar28;
  bool bVar29;
  ushort auStack_58 [20];
  
  tree = desc->dyn_tree;
  pcVar6 = desc->stat_desc->static_tree;
  uVar26 = desc->stat_desc->elems;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  uVar12 = 0;
  uVar15 = 0;
  if (0 < (int)uVar26) {
    uVar15 = (ulong)uVar26;
  }
  uVar21 = 0xffffffffffffffff;
  for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    if (tree[uVar12].fc.freq == 0) {
      tree[uVar12].dl.dad = 0;
    }
    else {
      iVar19 = s->heap_len;
      s->heap_len = iVar19 + 1;
      s->heap[(long)iVar19 + 1] = (int)uVar12;
      s->depth[uVar12] = '\0';
      uVar21 = uVar12 & 0xffffffff;
    }
  }
  while( true ) {
    uVar28 = s->heap_len;
    iVar19 = (int)uVar21;
    if (1 < (long)(int)uVar28) break;
    uVar14 = iVar19 + 1;
    uVar21 = uVar21 & 0xffffffff;
    if (iVar19 < 2) {
      uVar21 = (ulong)uVar14;
    }
    else {
      uVar14 = 0;
    }
    s->heap_len = uVar28 + 1;
    s->heap[(long)(int)uVar28 + 1] = uVar14;
    tree[(int)uVar14].fc.freq = 1;
    s->depth[(int)uVar14] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar6 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar6[(int)uVar14].dl.dad;
    }
  }
  desc->max_code = iVar19;
  for (uVar28 = uVar28 >> 1; 0 < (int)uVar28; uVar28 = uVar28 - 1) {
    pqdownheap(s,tree,uVar28);
  }
  iVar10 = s->heap_len;
  lVar16 = (long)(int)uVar26;
  do {
    iVar3 = s->heap[1];
    s->heap_len = iVar10 + -1;
    s->heap[1] = s->heap[iVar10];
    pqdownheap(s,tree,1);
    iVar10 = s->heap[1];
    iVar4 = s->heap_max;
    s->heap_max = iVar4 + -1;
    s->heap[(long)iVar4 + -1] = iVar3;
    iVar4 = s->heap_max;
    s->heap_max = iVar4 + -1;
    s->heap[(long)iVar4 + -1] = iVar10;
    tree[lVar16].fc.freq = tree[iVar10].fc.freq + tree[iVar3].fc.freq;
    bVar13 = s->depth[iVar10];
    if (s->depth[iVar10] < s->depth[iVar3]) {
      bVar13 = s->depth[iVar3];
    }
    s->depth[lVar16] = bVar13 + 1;
    tree[iVar10].dl.dad = (ush)lVar16;
    tree[iVar3].dl.dad = (ush)lVar16;
    s->heap[1] = (int)lVar16;
    pqdownheap(s,tree,1);
    iVar10 = s->heap_len;
    lVar16 = lVar16 + 1;
  } while (1 < iVar10);
  iVar10 = s->heap[1];
  iVar3 = s->heap_max;
  s->heap_max = iVar3 + -1;
  s->heap[(long)iVar3 + -1] = iVar10;
  pcVar6 = desc->dyn_tree;
  iVar10 = desc->max_code;
  psVar7 = desc->stat_desc;
  pcVar8 = psVar7->static_tree;
  piVar9 = psVar7->extra_bits;
  iVar3 = psVar7->extra_base;
  iVar4 = psVar7->max_length;
  lVar16 = (long)iVar4;
  for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
    s->bl_count[lVar18] = 0;
  }
  pcVar6[s->heap[s->heap_max]].dl.dad = 0;
  iVar17 = s->heap_max;
  iVar20 = 0;
  for (lVar18 = (long)iVar17; iVar17 = iVar17 + 1, lVar18 < 0x23c; lVar18 = lVar18 + 1) {
    iVar5 = s->heap[lVar18 + 1];
    uVar11 = pcVar6[pcVar6[iVar5].dl.dad].dl.dad;
    iVar24 = iVar4;
    if ((int)(uint)uVar11 < iVar4) {
      iVar24 = uVar11 + 1;
    }
    pcVar6[iVar5].dl.dad = (ush)iVar24;
    if (iVar5 <= iVar10) {
      s->bl_count[iVar24] = s->bl_count[iVar24] + 1;
      iVar25 = 0;
      if (iVar3 <= iVar5) {
        iVar25 = piVar9[iVar5 - iVar3];
      }
      uVar2 = pcVar6[iVar5].fc.freq;
      s->opt_len = s->opt_len + (ulong)(uint)(iVar24 + iVar25) * (ulong)uVar2;
      if (pcVar8 != (ct_data *)0x0) {
        s->static_len = s->static_len + (ulong)(iVar25 + (uint)pcVar8[iVar5].dl.dad) * (ulong)uVar2;
      }
    }
    iVar20 = iVar20 + (uint)(iVar4 <= (int)(uint)uVar11);
  }
  if (iVar20 != 0) {
    lVar23 = (lVar16 << 0x20) + 0x100000000;
    lVar18 = lVar23;
    puVar27 = s->bl_count + lVar16;
    do {
      do {
        lVar18 = lVar18 + -0x100000000;
        psVar1 = (short *)(puVar27 + -1);
        puVar27 = puVar27 + -1;
      } while (*psVar1 == 0);
      *puVar27 = *psVar1 - 1;
      psVar1 = (short *)((long)s->bl_count + (lVar18 >> 0x1f));
      *psVar1 = *psVar1 + 2;
      s->bl_count[lVar16] = s->bl_count[lVar16] - 1;
      bVar29 = 2 < iVar20;
      lVar18 = lVar23;
      puVar27 = s->bl_count + lVar16;
      iVar20 = iVar20 + -2;
    } while (bVar29);
    while (lVar18 = lVar16, lVar18 != 0) {
      uVar26 = (uint)s->bl_count[lVar18];
      while (bVar29 = uVar26 != 0, uVar26 = uVar26 - 1, lVar16 = lVar18 + -1, bVar29) {
        puVar27 = (ush *)(s->heap + (long)iVar17 + -1);
        do {
          iVar3 = *(int *)puVar27;
          iVar17 = iVar17 + -1;
          puVar27 = puVar27 + -2;
        } while (iVar10 < iVar3);
        lVar16 = lVar18 - (ulong)pcVar6[iVar3].dl.dad;
        if (lVar16 != 0) {
          s->opt_len = s->opt_len + lVar16 * (ulong)pcVar6[iVar3].fc.freq;
          pcVar6[iVar3].dl.dad = (ush)lVar18;
        }
      }
    }
  }
  uVar11 = 0;
  for (lVar16 = 0; lVar16 != 0xf; lVar16 = lVar16 + 1) {
    uVar11 = (uVar11 + s->bl_count[lVar16]) * 2;
    auStack_58[lVar16 + 1] = uVar11;
  }
  iVar10 = -1;
  if (-1 < iVar19) {
    iVar10 = iVar19;
  }
  for (lVar16 = 0; lVar16 != (long)iVar10 + 1; lVar16 = lVar16 + 1) {
    if (tree[lVar16].dl.dad != 0) {
      uVar28 = (uint)tree[lVar16].dl.dad;
      uVar14 = (uint)auStack_58[uVar28];
      auStack_58[uVar28] = auStack_58[uVar28] + 1;
      uVar28 = uVar28 + 1;
      uVar26 = 0;
      do {
        uVar22 = uVar26 | uVar14 & 1;
        uVar14 = uVar14 >> 1;
        uVar26 = uVar22 * 2;
        uVar28 = uVar28 - 1;
      } while (1 < uVar28);
      tree[lVar16].fc.freq = (ush)uVar22;
    }
  }
  return;
}

Assistant:

local void build_tree(deflate_state *s, tree_desc *desc) {
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n + 1].
     * heap[0] is not used.
     */
    s->heap_len = 0, s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--; if (stree) s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2 + 1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--) pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (uch)((s->depth[n] >= s->depth[m] ?
                                s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (ush)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr,"\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);

    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes ((ct_data *)tree, max_code, s->bl_count);
}